

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetCurrentFont(ImFont *font)

{
  ImFontAtlas *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pIVar3 = GImGui;
  if ((font != (ImFont *)0x0) && (pIVar1 = font->ContainerAtlas, pIVar1 != (ImFontAtlas *)0x0)) {
    fVar5 = font->Scale;
    fVar4 = 0.0;
    if (0.0 < fVar5) {
      GImGui->Font = font;
      fVar5 = fVar5 * (pIVar3->IO).FontGlobalScale * font->FontSize;
      fVar6 = 1.0;
      if (1.0 <= fVar5) {
        fVar6 = fVar5;
      }
      pIVar3->FontBaseSize = fVar6;
      pIVar2 = pIVar3->CurrentWindow;
      if (pIVar2 != (ImGuiWindow *)0x0) {
        fVar4 = fVar6 * pIVar2->FontWindowScale * pIVar2->FontDpiScale;
        if (pIVar2->ParentWindow != (ImGuiWindow *)0x0) {
          fVar4 = fVar4 * pIVar2->ParentWindow->FontWindowScale;
        }
      }
      pIVar3->FontSize = fVar4;
      (pIVar3->DrawListSharedData).TexUvWhitePixel = pIVar1->TexUvWhitePixel;
      (pIVar3->DrawListSharedData).TexUvLines = pIVar1->TexUvLines;
      (pIVar3->DrawListSharedData).Font = font;
      (pIVar3->DrawListSharedData).FontSize = fVar4;
      return;
    }
    __assert_fail("font->Scale > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1afa,"void ImGui::SetCurrentFont(ImFont *)");
  }
  __assert_fail("font && font->IsLoaded()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x1af9,"void ImGui::SetCurrentFont(ImFont *)");
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.TexUvLines = atlas->TexUvLines;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}